

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O3

void * __thiscall
Lib::
SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
::insertPositionRaw<Inferences::ALASCA::FourierMotzkinConf::Lhs>
          (SkipList<Inferences::ALASCA::FourierMotzkinConf::Lhs,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator>
           *this,Lhs *key)

{
  Node *ld2;
  Node *pNVar1;
  result_type_conflict1 rVar2;
  Comparison CVar3;
  Node *pNVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  Node *pNVar8;
  param_type local_38;
  
  uVar5 = 0xffffffff;
  do {
    local_38._M_a = 0;
    local_38._M_b = 1;
    rVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_38,&Random::_eng,&local_38);
    uVar5 = uVar5 + 1;
  } while (rVar2 != 0);
  uVar7 = this->_top;
  if (uVar7 <= uVar5) {
    if (uVar7 < 0x20) {
      this->_top = uVar7 + 1;
      uVar5 = uVar7;
    }
    else {
      uVar5 = uVar7 - 1;
    }
  }
  uVar6 = (ulong)uVar5 * 8 + 0x47 & 0xffffffff0;
  if (uVar6 == 0) {
    pNVar4 = (Node *)FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar6 < 0x11) {
    pNVar4 = (Node *)FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar6 < 0x19) {
    pNVar4 = (Node *)FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar6 < 0x21) {
    pNVar4 = (Node *)FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar6 < 0x31) {
    pNVar4 = (Node *)FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar6 < 0x41) {
    pNVar4 = (Node *)FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pNVar4 = (Node *)::operator_new(uVar6,0x10);
  }
  uVar6 = (ulong)this->_top;
  pNVar8 = this->_left;
LAB_0031bceb:
  do {
    uVar7 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar7;
    pNVar1 = pNVar8;
    do {
      pNVar8 = pNVar1;
      ld2 = pNVar8->nodes[uVar6];
      if (ld2 == (Node *)0x0) {
        if (uVar5 < uVar7) goto LAB_0031bceb;
        pNVar8->nodes[uVar6] = pNVar4;
        pNVar4->nodes[uVar6] = (Node *)0x0;
        goto LAB_0031bd38;
      }
      CVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::LDComparator
              ::compare<Inferences::ALASCA::FourierMotzkinConf::Lhs>(key,&ld2->value);
      pNVar1 = ld2;
    } while (((uint)CVar3 < 2) || (pNVar1 = pNVar8, CVar3 != LESS));
    if (uVar7 <= uVar5) {
      pNVar4->nodes[uVar6] = ld2;
      pNVar8->nodes[uVar6] = pNVar4;
LAB_0031bd38:
      if (uVar6 == 0) {
        return pNVar4;
      }
    }
  } while( true );
}

Assistant:

void* insertPositionRaw(Key key)
  {
    // select a random height between 0 and top
    unsigned nodeHeight = 0;
    while (Random::getBit()) {
      nodeHeight++;
    }
    if (nodeHeight >= _top) {
      if (_top < SKIP_LIST_MAX_HEIGHT) {
	nodeHeight = _top;
	_top++;
      }
      else {
	ASS(_top == SKIP_LIST_MAX_HEIGHT);
	nodeHeight = _top - 1;
      }
    }
    Node* newNode = allocate(nodeHeight);


    unsigned h = _top - 1;


    // left is a node with a value smaller than that of newNode and having
    // a large enough height.
    // this node is on the left of the inserted one
    Node* left = _left;
    for (;;) {
      Node* next = left->nodes[h];
      if (next == 0) {
	if(h<=nodeHeight) {
	  left->nodes[h] = newNode;
	  newNode->nodes[h] = 0;
	  if (h == 0) {
	    return &newNode->value;
	  }
	}
	h--;
	continue;
      }
      // next != 0
      switch (ValueComparator::compare(key,next->value))
	{
	case LESS:
	  // the node should be inserted on the left
	  if(h<=nodeHeight) {
	    newNode->nodes[h] = next;
	    left->nodes[h] = newNode;
	    if (h == 0) {
	      return &newNode->value;
	    }
	  }
	  h--;
	  break;

	case EQUAL: //we insert equal elements next to each other
	case GREATER:
	  left = next;
	  break;

#if VDEBUG
	default:
	  ASSERTION_VIOLATION;
#endif
	}
    }
  }